

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O1

void __thiscall Clasp::ShortImplicationsGraph::resize(ShortImplicationsGraph *this,uint32 nodes)

{
  size_type sVar1;
  pointer pIVar2;
  uint __tmp;
  uint uVar3;
  uint uVar4;
  uint32 uVar5;
  pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
  local_68;
  ImplicationList local_58;
  
  if ((this->graph_).ebo_.size < nodes) {
    if ((this->graph_).ebo_.cap < nodes) {
      local_68.ebo_.buf = (pointer)0x0;
      local_68.ebo_.size = 0;
      local_68.ebo_.cap = 0;
      local_58.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_ =
           &local_58.super_ImpListBase.super_type.
            super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
            field_0x14;
      local_58.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>._8_4_ = 0x20;
      local_58.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_ = 0;
      local_58.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ = 0x20
      ;
      LOCK();
      local_58.learnt._M_b._M_p = (__base_type)(__pointer_type)0x0;
      UNLOCK();
      bk_lib::
      pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
      ::resize(&local_68,nodes,&local_58);
      ImplicationList::~ImplicationList(&local_58);
      uVar3 = (this->graph_).ebo_.size;
      if (uVar3 != 0) {
        uVar4 = 0;
        do {
          ImplicationList::move(local_68.ebo_.buf + uVar4,(this->graph_).ebo_.buf + uVar4);
          uVar4 = uVar4 + 1;
          uVar3 = (this->graph_).ebo_.size;
        } while (uVar4 != uVar3);
      }
      pIVar2 = (this->graph_).ebo_.buf;
      (this->graph_).ebo_.buf = local_68.ebo_.buf;
      sVar1 = (this->graph_).ebo_.cap;
      (this->graph_).ebo_.size = local_68.ebo_.size;
      (this->graph_).ebo_.cap = local_68.ebo_.cap;
      local_68.ebo_.cap = sVar1;
      local_68.ebo_.size = uVar3;
      if (pIVar2 != (pointer)0x0) {
        local_68.ebo_.buf = pIVar2;
        operator_delete(pIVar2);
      }
    }
    else {
      local_58.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_ =
           &local_58.super_ImpListBase.super_type.
            super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
            field_0x14;
      local_58.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>._8_4_ = 0x20;
      local_58.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_ = 0;
      local_58.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ = 0x20
      ;
      LOCK();
      local_58.learnt._M_b._M_p = (__base_type)(__pointer_type)0x0;
      UNLOCK();
      bk_lib::
      pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
      ::resize(&this->graph_,nodes,&local_58);
      ImplicationList::~ImplicationList(&local_58);
    }
  }
  else {
    uVar5 = (this->graph_).ebo_.size;
    while (uVar5 != nodes) {
      ImplicationList::clear((this->graph_).ebo_.buf + (uVar5 - 1),true);
      uVar5 = (this->graph_).ebo_.size - 1;
      (this->graph_).ebo_.size = uVar5;
    }
  }
  return;
}

Assistant:

void ShortImplicationsGraph::resize(uint32 nodes) {
	if (nodes <= graph_.size()) {
		while (graph_.size() != nodes) {
			graph_.back().clear(true);
			graph_.pop_back();
		}
	}
	else if (graph_.capacity() >= nodes) {
		graph_.resize(nodes);
	}
	else {
		ImpLists temp; temp.resize(nodes);
		for (ImpLists::size_type i = 0; i != graph_.size(); ++i) {
			temp[i].move(graph_[i]);
		}
		graph_.swap(temp);
	}
}